

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

double benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  double *pdVar1;
  matrix<double,_remora::row_major,_remora::cpu_tag> *pmVar2;
  size_type sVar3;
  size_type sVar4;
  long lVar5;
  matrix<double,_remora::column_major,_remora::cpu_tag> *this;
  size_type sVar6;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RSI;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  undefined1 auVar7 [16];
  Timer time;
  size_t i;
  double minTime;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Timer *in_stack_ffffffffffffff40;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff48;
  double local_b0 [7];
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff88;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff90;
  long local_28;
  double local_20 [2];
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20[0] = std::numeric_limits<double>::max();
  for (local_28 = 0; local_28 != 10; local_28 = local_28 + 1) {
    Timer::Timer(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
    remora::
    prod<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    remora::noalias<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff48);
    remora::noalias_proxy<remora::matrix<double,remora::row_major,remora::cpu_tag>>::operator+=
              ((noalias_proxy<remora::matrix<double,_remora::row_major,_remora::cpu_tag>_> *)
               in_stack_ffffffffffffff40,
               (matrix_matrix_prod<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::matrix<double,_remora::column_major,_remora::cpu_tag>_>
                *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_b0[0] = Timer::stop(in_stack_ffffffffffffff40);
    pdVar1 = std::min<double>(local_20,local_b0);
    local_20[0] = *pdVar1;
  }
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar3 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar2);
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar4 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size2(pmVar2);
  lVar5 = sVar3 * sVar4;
  this = remora::
         matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(local_10);
  sVar6 = remora::matrix<double,_remora::column_major,_remora::cpu_tag>::size2(this);
  lVar5 = lVar5 * sVar6;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  return ((((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / local_20[0]) / 1024.0)
         / 1024.0;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += prod(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}